

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O0

ma_result ma_job_queue_init_preallocated
                    (ma_job_queue_config *pConfig,void *pHeap,ma_job_queue *pQueue)

{
  ma_slot_allocator_config local_74;
  undefined1 auStack_70 [4];
  ma_slot_allocator_config allocatorConfig;
  ma_job_queue_heap_layout heapLayout;
  ma_result result;
  ma_job_queue *pQueue_local;
  void *pHeap_local;
  ma_job_queue_config *pConfig_local;
  
  if (pQueue == (ma_job_queue *)0x0) {
    pConfig_local._4_4_ = MA_INVALID_ARGS;
  }
  else {
    memset(pQueue,0,0xc0);
    pConfig_local._4_4_ =
         ma_job_queue_get_heap_layout(pConfig,(ma_job_queue_heap_layout *)auStack_70);
    if (pConfig_local._4_4_ == MA_SUCCESS) {
      pQueue->_pHeap = pHeap;
      if (_auStack_70 != 0) {
        memset(pHeap,0,_auStack_70);
      }
      pQueue->flags = pConfig->flags;
      pQueue->capacity = pConfig->capacity;
      pQueue->pJobs = (ma_job *)((long)pHeap + heapLayout.allocatorOffset);
      local_74 = ma_slot_allocator_config_init(pConfig->capacity);
      pConfig_local._4_4_ =
           ma_slot_allocator_init_preallocated
                     (&local_74,(void *)((long)pHeap + heapLayout.sizeInBytes),&pQueue->allocator);
      if (pConfig_local._4_4_ == MA_SUCCESS) {
        if ((pQueue->flags & 1) == 0) {
          ma_semaphore_init(L'\0',&pQueue->sem);
        }
        ma_slot_allocator_alloc(&pQueue->allocator,&pQueue->head);
        pQueue->pJobs[pQueue->head & 0xffff].next = 0xffffffffffffffff;
        pQueue->tail = pQueue->head;
        pConfig_local._4_4_ = MA_SUCCESS;
      }
    }
  }
  return pConfig_local._4_4_;
}

Assistant:

MA_API ma_result ma_job_queue_init_preallocated(const ma_job_queue_config* pConfig, void* pHeap, ma_job_queue* pQueue)
{
    ma_result result;
    ma_job_queue_heap_layout heapLayout;
    ma_slot_allocator_config allocatorConfig;

    if (pQueue == NULL) {
        return MA_INVALID_ARGS;
    }

    MA_ZERO_OBJECT(pQueue);

    result = ma_job_queue_get_heap_layout(pConfig, &heapLayout);
    if (result != MA_SUCCESS) {
        return result;
    }

    pQueue->_pHeap = pHeap;
    MA_ZERO_MEMORY(pHeap, heapLayout.sizeInBytes);

    pQueue->flags    = pConfig->flags;
    pQueue->capacity = pConfig->capacity;
    pQueue->pJobs    = (ma_job*)ma_offset_ptr(pHeap, heapLayout.jobsOffset);

    allocatorConfig = ma_slot_allocator_config_init(pConfig->capacity);
    result = ma_slot_allocator_init_preallocated(&allocatorConfig, ma_offset_ptr(pHeap, heapLayout.allocatorOffset), &pQueue->allocator);
    if (result != MA_SUCCESS) {
        return result;
    }

    /* We need a semaphore if we're running in non-blocking mode. If threading is disabled we need to return an error. */
    if ((pQueue->flags & MA_JOB_QUEUE_FLAG_NON_BLOCKING) == 0) {
        #ifndef MA_NO_THREADING
        {
            ma_semaphore_init(0, &pQueue->sem);
        }
        #else
        {
            /* Threading is disabled and we've requested non-blocking mode. */
            return MA_INVALID_OPERATION;
        }
        #endif
    }

    /*
    Our queue needs to be initialized with a free standing node. This should always be slot 0. Required for the lock free algorithm. The first job in the queue is
    just a dummy item for giving us the first item in the list which is stored in the "next" member.
    */
    ma_slot_allocator_alloc(&pQueue->allocator, &pQueue->head);  /* Will never fail. */
    pQueue->pJobs[ma_job_extract_slot(pQueue->head)].next = MA_JOB_ID_NONE;
    pQueue->tail = pQueue->head;

    return MA_SUCCESS;
}